

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

int Dch_ClassesRefineConst1Group(Dch_Cla_t *p,Vec_Ptr_t *vRoots,int fRecursive)

{
  Aig_Obj_t **pClass;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *local_70;
  int local_44;
  int i;
  Aig_Obj_t **ppClassNew;
  Aig_Obj_t *pReprNew;
  Aig_Obj_t *pObj;
  int fRecursive_local;
  Vec_Ptr_t *vRoots_local;
  Dch_Cla_t *p_local;
  
  iVar1 = Vec_PtrSize(vRoots);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    Vec_PtrClear(p->vClassNew);
    for (local_44 = 0; iVar1 = Vec_PtrSize(vRoots), local_44 < iVar1; local_44 = local_44 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vRoots,local_44);
      iVar1 = (*p->pFuncNodeIsConst)(p->pManData,pAVar2);
      if (iVar1 == 0) {
        Vec_PtrPush(p->vClassNew,pAVar2);
      }
    }
    iVar1 = Vec_PtrSize(p->vClassNew);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      iVar1 = Vec_PtrSize(p->vClassNew);
      p->nCands1 = p->nCands1 - iVar1;
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0);
      Aig_ObjSetRepr(p->pAig,pAVar2,(Aig_Obj_t *)0x0);
      iVar1 = Vec_PtrSize(p->vClassNew);
      if (iVar1 == 1) {
        p_local._4_4_ = 1;
      }
      else {
        pClass = p->pMemClassesFree;
        iVar1 = Vec_PtrSize(p->vClassNew);
        p->pMemClassesFree = p->pMemClassesFree + iVar1;
        for (local_44 = 0; iVar1 = Vec_PtrSize(p->vClassNew), local_44 < iVar1;
            local_44 = local_44 + 1) {
          pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,local_44);
          pClass[local_44] = pObj_00;
          local_70 = pAVar2;
          if (local_44 == 0) {
            local_70 = (Aig_Obj_t *)0x0;
          }
          Aig_ObjSetRepr(p->pAig,pObj_00,local_70);
        }
        iVar1 = Vec_PtrSize(p->vClassNew);
        Dch_ObjAddClass(p,pAVar2,pClass,iVar1);
        if (fRecursive == 0) {
          p_local._4_4_ = 1;
        }
        else {
          iVar1 = Dch_ClassesRefineOneClass(p,pAVar2,1);
          p_local._4_4_ = iVar1 + 1;
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Dch_ClassesRefineConst1Group( Dch_Cla_t * p, Vec_Ptr_t * vRoots, int fRecursive )
{
    Aig_Obj_t * pObj, * pReprNew, ** ppClassNew;
    int i;
    if ( Vec_PtrSize(vRoots) == 0 )
        return 0;
    // collect the nodes to be refined
    Vec_PtrClear( p->vClassNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        if ( !p->pFuncNodeIsConst( p->pManData, pObj ) )
            Vec_PtrPush( p->vClassNew, pObj );
    // check if there is a new class
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
    p->nCands1 -= Vec_PtrSize(p->vClassNew);
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    Aig_ObjSetRepr( p->pAig, pReprNew, NULL );
    if ( Vec_PtrSize(p->vClassNew) == 1 )
        return 1;
    // create a new class composed of these nodes
    ppClassNew = p->pMemClassesFree;
    p->pMemClassesFree += Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }
    Dch_ObjAddClass( p, pReprNew, ppClassNew, Vec_PtrSize(p->vClassNew) );
    // refine them recursively
    if ( fRecursive )
        return 1 + Dch_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}